

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_port.hpp
# Opt level: O0

iu_off_t iutest::internal::posix::FileTell(FILE *fp)

{
  __off64_t _Var1;
  FILE *fp_local;
  
  _Var1 = ftello64((FILE *)fp);
  return _Var1;
}

Assistant:

inline iu_off_t FileTell(FILE* fp)
{
#if defined(_MSC_VER)
    return static_cast<iu_off_t>(_ftelli64(fp));
#elif defined(_LARGEFILE64_SOURCE)
    return static_cast<iu_off_t>(ftello64(fp));
#elif IUTEST_HAS_LARGEFILE_API
    return static_cast<iu_off_t>(ftello(fp));
#else
    return static_cast<iu_off_t>(ftell(fp));
#endif
}